

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

void release_current_frame(AV1Decoder *pbi)

{
  pthread_mutex_t *__mutex;
  RefCntBuffer *pRVar1;
  
  __mutex = (pthread_mutex_t *)(pbi->common).buffer_pool;
  (((pbi->common).cur_frame)->buf).corrupted = 1;
  pthread_mutex_lock(__mutex);
  pRVar1 = (pbi->common).cur_frame;
  if (((pRVar1 != (RefCntBuffer *)0x0) &&
      (pRVar1->ref_count = pRVar1->ref_count + -1, pRVar1->ref_count == 0)) &&
     ((pRVar1->raw_frame_buffer).data != (uint8_t *)0x0)) {
    (**(code **)((long)__mutex + 0x38))(__mutex[1].__align,&pRVar1->raw_frame_buffer);
    (pRVar1->raw_frame_buffer).data = (uint8_t *)0x0;
    (pRVar1->raw_frame_buffer).size = 0;
    (pRVar1->raw_frame_buffer).priv = (void *)0x0;
  }
  pthread_mutex_unlock(__mutex);
  (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  return;
}

Assistant:

static void release_current_frame(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  BufferPool *const pool = cm->buffer_pool;

  cm->cur_frame->buf.corrupted = 1;
  lock_buffer_pool(pool);
  decrease_ref_count(cm->cur_frame, pool);
  unlock_buffer_pool(pool);
  cm->cur_frame = NULL;
}